

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::SharedMemoryArbiterImpl::FlushPendingCommitDataRequests
          (SharedMemoryArbiterImpl *this,function<void_()> *callback)

{
  ushort size;
  uint uVar1;
  TaskRunner *pTVar2;
  pointer pCVar3;
  ProducerEndpoint *pPVar4;
  _Manager_type p_Var5;
  undefined8 uVar6;
  int iVar7;
  CommitDataRequest_ChunksToMove *ctm;
  pointer pCVar8;
  CommitDataRequest *pCVar9;
  unique_lock<std::mutex> scoped_lock;
  Chunk chunk;
  unique_lock<std::mutex> local_138;
  _Any_data local_128;
  _Manager_type local_118;
  _Invoker_type local_110;
  function<void_()> *local_108;
  SharedMemoryABI *local_100;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined1 local_b8 [16];
  function<void_()> local_a8 [2];
  Chunk local_50;
  Chunk local_40;
  
  local_138._M_device = &this->lock_;
  local_138._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_138);
  local_138._M_owns = true;
  if (this->fully_bound_ == false) {
    if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                (&this->pending_flush_callbacks_,callback);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_138);
    pCVar9 = (CommitDataRequest *)0x0;
    goto LAB_002c1204;
  }
  pTVar2 = this->task_runner_;
  iVar7 = (*pTVar2->_vptr_TaskRunner[6])(pTVar2);
  if ((char)iVar7 == '\0') {
    std::unique_lock<std::mutex>::unlock(&local_138);
    local_b8._0_8_ =
         (this->weak_ptr_factory_).weak_ptr_.handle_.
         super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar8 = (pointer)(this->weak_ptr_factory_).weak_ptr_.handle_.
                      super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
    if (pCVar8 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pCVar8->page_ = pCVar8->page_ + 1;
        UNLOCK();
      }
      else {
        pCVar8->page_ = pCVar8->page_ + 1;
      }
    }
    if (pCVar8 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pCVar8->page_ = pCVar8->page_ + 1;
        UNLOCK();
      }
      else {
        pCVar8->page_ = pCVar8->page_ + 1;
      }
    }
    local_b8._8_8_ = pCVar8;
    ::std::function<void_()>::function(local_a8,(function<void_()> *)callback);
    local_e8 = (code *)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8 = (undefined8 *)0x0;
    uStack_f0 = 0;
    local_f8 = (undefined8 *)operator_new(0x30);
    uVar6 = local_b8._8_8_;
    *local_f8 = local_b8._0_8_;
    local_f8[1] = 0;
    local_b8._8_8_ = (pointer)0x0;
    local_f8[1] = uVar6;
    local_b8._0_8_ = (_func_int **)0x0;
    local_f8[4] = 0;
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[5] = local_a8[0]._M_invoker;
    if ((pointer)local_a8[0].super__Function_base._M_manager != (pointer)0x0) {
      local_f8[2] = local_a8[0].super__Function_base._M_functor._M_unused._M_object;
      local_f8[3] = local_a8[0].super__Function_base._M_functor._8_8_;
      local_f8[4] = local_a8[0].super__Function_base._M_manager;
      local_a8[0].super__Function_base._M_manager = (_Manager_type)0x0;
      local_a8[0]._M_invoker = (_Invoker_type)0x0;
    }
    pcStack_e0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:38782:29)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:38782:29)>
               ::_M_manager;
    (*pTVar2->_vptr_TaskRunner[2])(pTVar2);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,3);
    }
    if ((pointer)local_a8[0].super__Function_base._M_manager != (pointer)0x0) {
      (*local_a8[0].super__Function_base._M_manager)(local_a8,local_a8,3);
    }
    if ((pointer)local_b8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if (pCVar8 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar8);
    }
LAB_002c1113:
    pCVar9 = (CommitDataRequest *)0x0;
  }
  else {
    if ((this->commit_data_req_)._M_t.
        super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
        ._M_t.
        super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
        .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl ==
        (CommitDataRequest *)0x0) goto LAB_002c1113;
    local_108 = (function<void_()> *)callback;
    ReplaceCommitPlaceholderBufferIdsLocked(this);
    pCVar9 = (this->commit_data_req_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl;
    pCVar8 = *(pointer *)
              &(pCVar9->chunks_to_move_).
               super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
               ._M_impl;
    pCVar3 = (pCVar9->chunks_to_move_).
             super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar8 != pCVar3) {
      local_100 = &this->shmem_abi_;
      do {
        uVar1 = *(uint *)((this->shmem_abi_).start_ +
                         (ulong)pCVar8->page_ * (this->shmem_abi_).page_size_);
        if ((uVar1 >> ((char)pCVar8->chunk_ * '\x02' & 0x1fU) & 3) == 1) {
          size = *(ushort *)
                  ((long)(this->shmem_abi_).chunk_sizes_._M_elems + (ulong)(uVar1 >> 0x1b & 0xe));
          SharedMemoryABI::Chunk::Chunk
                    (&local_40,
                     (this->shmem_abi_).start_ +
                     (ulong)pCVar8->chunk_ * (ulong)size +
                     (ulong)pCVar8->page_ * (this->shmem_abi_).page_size_ + 8,size,
                     (uint8_t)pCVar8->chunk_);
          SharedMemoryABI::Chunk::Chunk(&local_50,&local_40);
          SharedMemoryABI::Chunk::Chunk((Chunk *)local_b8,&local_50);
          SharedMemoryABI::ReleaseChunk(local_100,(Chunk *)local_b8,kChunkComplete);
        }
        pCVar8 = pCVar8 + 1;
      } while (pCVar8 != pCVar3);
    }
    pCVar9 = (this->commit_data_req_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl;
    (this->commit_data_req_)._M_t.
    super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
    .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl =
         (CommitDataRequest *)0x0;
    this->bytes_pending_commit_ = 0;
    callback = (function<void_()> *)local_108;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_138);
  if ((char)iVar7 != '\0') {
    if (pCVar9 == (CommitDataRequest *)0x0) {
      if ((((function<void_()> *)callback)->super__Function_base)._M_manager != (_Manager_type)0x0)
      {
        pPVar4 = this->producer_endpoint_;
        protos::gen::CommitDataRequest::CommitDataRequest((CommitDataRequest *)local_b8);
        local_128._M_unused._M_object = (void *)0x0;
        local_128._8_8_ = 0;
        local_118 = (_Manager_type)0x0;
        local_110 = ((function<void_()> *)callback)->_M_invoker;
        p_Var5 = (((function<void_()> *)callback)->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          local_128._M_unused._0_8_ =
               (undefined8)
               *(undefined8 *)&(((function<void_()> *)callback)->super__Function_base)._M_functor;
          local_128._8_8_ =
               *(undefined8 *)
                ((long)&(((function<void_()> *)callback)->super__Function_base)._M_functor + 8);
          (((function<void_()> *)callback)->super__Function_base)._M_manager = (_Manager_type)0x0;
          ((function<void_()> *)callback)->_M_invoker = (_Invoker_type)0x0;
          local_118 = p_Var5;
        }
        (*pPVar4->_vptr_ProducerEndpoint[7])(pPVar4,local_b8,&local_128);
        if (local_118 != (_Manager_type)0x0) {
          (*local_118)(&local_128,&local_128,__destroy_functor);
        }
        protos::gen::CommitDataRequest::~CommitDataRequest((CommitDataRequest *)local_b8);
      }
    }
    else {
      pPVar4 = this->producer_endpoint_;
      ::std::function<void_()>::function
                ((function<void_()> *)&local_d8,(function<void_()> *)callback);
      (*pPVar4->_vptr_ProducerEndpoint[7])(pPVar4,pCVar9,&local_d8);
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,__destroy_functor);
      }
    }
  }
LAB_002c1204:
  if (pCVar9 != (CommitDataRequest *)0x0) {
    (*(pCVar9->super_CppMessageObj)._vptr_CppMessageObj[1])(pCVar9);
  }
  return;
}

Assistant:

void SharedMemoryArbiterImpl::FlushPendingCommitDataRequests(
    std::function<void()> callback) {
  std::unique_ptr<CommitDataRequest> req;
  {
    std::unique_lock<std::mutex> scoped_lock(lock_);

    // Flushing is only supported while |fully_bound_|, and there may still be
    // unbound startup trace writers. If so, skip the commit for now - it'll be
    // done when |fully_bound_| is updated.
    if (!fully_bound_) {
      if (callback)
        pending_flush_callbacks_.push_back(callback);
      return;
    }

    // May be called by TraceWriterImpl on any thread.
    base::TaskRunner* task_runner = task_runner_;
    if (!task_runner->RunsTasksOnCurrentThread()) {
      // We shouldn't post a task while holding a lock. |task_runner| remains
      // valid after unlocking, because |task_runner_| is never reset.
      scoped_lock.unlock();

      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner->PostTask([weak_this, callback] {
        if (weak_this)
          weak_this->FlushPendingCommitDataRequests(std::move(callback));
      });
      return;
    }

    // |commit_data_req_| could have become a nullptr, for example when a forced
    // sync flush happens in GetNewChunk().
    if (commit_data_req_) {
      // Make sure any placeholder buffer IDs from StartupWriters are replaced
      // before sending the request.
      bool all_placeholders_replaced =
          ReplaceCommitPlaceholderBufferIdsLocked();
      // We're |fully_bound_|, thus all writers are bound and all placeholders
      // should have been replaced.
      PERFETTO_DCHECK(all_placeholders_replaced);

      // In order to allow patching in the producer we delay the kChunkComplete
      // transition and keep batched chunks in the kChunkBeingWritten state.
      // Since we are about to notify the service of all batched chunks, it will
      // not be possible to apply any more patches to them and we need to move
      // them to kChunkComplete - otherwise the service won't look at them.
      for (auto& ctm : commit_data_req_->chunks_to_move()) {
        uint32_t layout = shmem_abi_.GetPageLayout(ctm.page());
        auto chunk_state =
            shmem_abi_.GetChunkStateFromLayout(layout, ctm.chunk());
        // Note: the subset of |commit_data_req_| chunks that still need
        // patching is also the subset of chunks that are still being written
        // to. The rest of the chunks in |commit_data_req_| do not need patching
        // and have already been marked as complete.
        if (chunk_state != SharedMemoryABI::kChunkBeingWritten)
          continue;

        SharedMemoryABI::Chunk chunk =
            shmem_abi_.GetChunkUnchecked(ctm.page(), layout, ctm.chunk());
        shmem_abi_.ReleaseChunkAsComplete(std::move(chunk));
      }

      req = std::move(commit_data_req_);
      bytes_pending_commit_ = 0;
    }
  }  // scoped_lock

  if (req) {
    producer_endpoint_->CommitData(*req, callback);
  } else if (callback) {
    // If |req| was nullptr, it means that an enqueued deferred commit was
    // executed just before this. At this point send an empty commit request
    // to the service, just to linearize with it and give the guarantee to the
    // caller that the data has been flushed into the service.
    producer_endpoint_->CommitData(CommitDataRequest(), std::move(callback));
  }
}